

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall ON_Surface::IsCylinder(ON_Surface *this,ON_Cylinder *cylinder,double tolerance)

{
  double dVar1;
  undefined1 auVar2 [16];
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  ON_Plane *pOVar14;
  ON_Circle *pOVar15;
  byte bVar16;
  ulong uVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  ON_Line line;
  ON_Arc arc;
  ON_3dPoint local_1a0;
  undefined1 local_188 [16];
  double local_178;
  undefined8 uStack_170;
  undefined4 local_160;
  uint local_15c;
  void *local_158;
  ON_Cylinder *local_150;
  ON_Line local_148;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  ON_Curve *pOVar9;
  
  bVar16 = 0;
  local_188._8_4_ = in_XMM0_Dc;
  local_188._0_8_ = tolerance;
  local_188._12_4_ = in_XMM0_Dd;
  bVar3 = ON_IsValid(tolerance);
  uVar18 = local_188._0_4_;
  uVar19 = local_188._4_4_;
  uVar20 = local_188._8_4_;
  uVar21 = local_188._12_4_;
  if (!bVar3) {
    uVar18 = 0;
    uVar19 = 0x3df00000;
    uVar20 = 0;
    uVar21 = 0;
  }
  uVar17 = -(ulong)(0.0 < local_188._0_8_);
  uVar13 = CONCAT44(uVar19,uVar18) & uVar17;
  uVar18 = (undefined4)uVar13;
  uVar19 = (undefined4)(uVar13 >> 0x20);
  uVar11 = CONCAT44(uVar21,uVar20) & local_188._8_8_;
  auVar22._0_8_ = ~uVar17 & 0x3df0000000000000;
  auVar22._8_8_ = 0;
  auVar2._8_4_ = (int)uVar11;
  auVar2._0_8_ = uVar13;
  auVar2._12_4_ = (int)(uVar11 >> 0x20);
  local_188 = auVar22 | auVar2;
  bVar3 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  if (bVar3) {
    bVar4 = ON_RevSurface::IsCylindrical((ON_RevSurface *)this,cylinder,(double)local_188._0_8_);
  }
  else {
    bVar4 = false;
  }
  if (bVar3 || bVar4 != false) {
    return bVar4;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.y = (double)CONCAT44(uVar19,uVar18);
  dVar1 = ON_Interval::Mid((ON_Interval *)&local_c8);
  bVar12 = 0;
  iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar1,0),this,0);
  pOVar9 = (ON_Curve *)CONCAT44(extraout_var,iVar6);
  if (pOVar9 == (ON_Curve *)0x0) goto LAB_005ac109;
  pOVar14 = &ON_Plane::World_xy;
  pOVar15 = &local_c8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pOVar15->plane).origin.x = (pOVar14->origin).x;
    pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar15 = (ON_Circle *)((long)pOVar15 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  local_150 = cylinder;
  ON_Line::ON_Line(&local_148);
  uVar18 = local_188._0_4_;
  uVar19 = local_188._4_4_;
  local_178 = (double)(-(ulong)(2.3283064365386963e-10 < local_188._0_8_) & (ulong)local_188._0_8_);
  uStack_170 = 0;
  iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar9,0,&local_c8);
  bVar16 = (byte)iVar6;
  if (bVar16 == 0) {
    iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                      (local_178._0_4_,pOVar9);
    bVar5 = (byte)iVar6;
    if (bVar5 != 0) {
      ON_Curve::PointAtStart(&local_1a0,pOVar9);
      local_148.from.z = local_1a0.z;
      local_148.from.x = local_1a0.x;
      local_148.from.y = local_1a0.y;
      ON_Curve::PointAtEnd(&local_1a0,pOVar9);
      local_148.to.z = local_1a0.z;
      local_148.to.x = local_1a0.x;
      local_148.to.y = local_1a0.y;
    }
  }
  else {
    bVar5 = 0;
  }
  (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar9);
  if ((bVar16 | bVar5) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_1a0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_1a0.y = (double)CONCAT44(uVar19,uVar18);
    dVar1 = ON_Interval::Mid((ON_Interval *)&local_1a0);
    iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar1,0),this,1);
    pOVar9 = (ON_Curve *)CONCAT44(extraout_var_00,iVar6);
    if (pOVar9 == (ON_Curve *)0x0) goto LAB_005ac0ed;
    if (bVar16 == 0) {
      iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                        (local_178._0_4_,pOVar9,0,&local_c8);
      bVar16 = (byte)iVar6;
    }
    else if (bVar5 == 0) {
      iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                        (local_178._0_4_,pOVar9);
      bVar5 = (byte)iVar6;
      if (bVar5 != 0) {
        ON_Curve::PointAtStart(&local_1a0,pOVar9);
        local_148.from.z = local_1a0.z;
        local_148.from.x = local_1a0.x;
        local_148.from.y = local_1a0.y;
        ON_Curve::PointAtEnd(&local_1a0,pOVar9);
        local_148.to.z = local_1a0.z;
        local_148.to.x = local_1a0.x;
        local_148.to.y = local_1a0.y;
      }
    }
    else {
      bVar5 = 1;
    }
    (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar9);
    bVar12 = 0;
    if ((bVar5 != 0) && (bVar16 != 0)) {
      local_178 = local_c8.radius;
      p.y = local_148.from.y;
      p.x = local_148.from.x;
      p.z = local_148.from.z;
      ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p);
      dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
      if ((double)local_188._0_8_ <= local_178 * 7.450580596925e-09) {
        local_188._0_8_ = local_178 * 7.450580596925e-09;
      }
      if (ABS(local_c8.radius - dVar1) <= (double)local_188._0_8_) {
        p_00.y = local_148.to.y;
        p_00.x = local_148.to.x;
        p_00.z = local_148.to.z;
        ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p_00);
        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
        if (ABS(local_c8.radius - dVar1) <= (double)local_188._0_8_) {
          uVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
          uVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
          memblock = onmalloc((long)(int)(uVar7 + uVar8 + 2) << 3);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
          local_f0 = (long)(int)uVar7 * 8 + 8 + (long)memblock;
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
          uVar13 = (ulong)((int)uVar7 < 1);
          if (0 < (int)uVar7) {
            local_110 = (ulong)uVar7;
            uVar11 = 0;
            local_158 = memblock;
            local_108 = (ulong)uVar8;
            local_f8 = (ulong)uVar8;
            do {
              local_160 = (undefined4)uVar13;
              uVar7 = (uint)(uVar11 != 0);
              local_100 = uVar11;
              do {
                local_178 = ((double)(int)(4 - uVar7) * *(double *)((long)local_158 + local_100 * 8)
                            + (double)(int)uVar7 * *(double *)((long)local_158 + local_100 * 8 + 8))
                            * 0.25;
                local_15c = uVar7;
                if (0 < (int)local_108) {
                  uVar11 = 0;
                  do {
                    uVar13 = uVar11;
                    uVar7 = (uint)(uVar13 != 0);
                    iVar6 = 4 - (uint)(uVar13 != 0);
                    do {
                      PointAt(&local_1a0,this,local_178,
                              ((double)iVar6 * *(double *)(local_f0 + uVar13 * 8) +
                              (double)(int)uVar7 * *(double *)(local_f0 + 8 + uVar13 * 8)) * 0.25);
                      local_d8 = local_1a0.z;
                      local_e8 = local_1a0.x;
                      dStack_e0 = local_1a0.y;
                      p_01.y = local_1a0.y;
                      p_01.x = local_1a0.x;
                      p_01.z = local_1a0.z;
                      ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p_01);
                      dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
                      if ((double)local_188._0_8_ < ABS(local_c8.radius - dVar1)) {
                        onfree(local_158);
                        bVar12 = (byte)local_160;
                        goto LAB_005ac0ef;
                      }
                      uVar7 = uVar7 + 1;
                      iVar6 = iVar6 + -1;
                    } while (uVar7 != 5);
                    uVar11 = uVar13 + 1;
                  } while (uVar13 + 1 != local_f8);
                }
                uVar7 = local_15c + 1;
              } while (uVar7 != 5);
              uVar11 = local_100 + 1;
              uVar13 = CONCAT71((int7)(uVar13 >> 8),local_110 <= uVar11);
              memblock = local_158;
            } while (uVar11 != local_110);
          }
          bVar12 = (byte)uVar13;
          onfree(memblock);
          if (local_150 == (ON_Cylinder *)0x0) {
            bVar4 = true;
          }
          else {
            ON_Cylinder::Create(local_150,&local_c8);
            bVar4 = ON_Cylinder::IsValid(local_150);
          }
          goto LAB_005ac0ef;
        }
      }
      goto LAB_005ac0ed;
    }
  }
  else {
LAB_005ac0ed:
    bVar12 = 0;
  }
LAB_005ac0ef:
  ON_Line::~ON_Line(&local_148);
  ON_Plane::~ON_Plane(&local_c8.plane);
LAB_005ac109:
  return (bool)(bVar12 & bVar4);
}

Assistant:

bool ON_Surface::IsCylinder( ON_Cylinder* cylinder, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  bool rc = rs && rs->IsCylindrical(cylinder,tolerance);

  if ( !rc && !rs )
  {
    ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
    if ( !crv )
      return false;

    ON_Arc arc;
    ON_Line line;
    int bIsLine = 0;
    int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( !bIsArc )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc && !bIsLine )
      return false;

    crv = IsoCurve(1,Domain(0).Mid());
    if ( !crv )
      return false;
    if ( !bIsArc )
      bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    else if ( !bIsLine )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc || !bIsLine )
      return false;

    double tol = 0.5*ON_SQRT_EPSILON*(arc.radius);
    if ( tol < tolerance )
      tol = tolerance;
    double r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
    if ( fabs(arc.radius - r) > tol )
      return false;
    r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
    if ( fabs(arc.radius - r) > tol )
      return false;

    ON_3dPoint P;
    double u, v;
    int sc0 = SpanCount(0);
    int sc1 = SpanCount(1);
    double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
    double* t = s + (sc0+1);
    GetSpanVector(0,s);
    GetSpanVector(1,t);
    for ( int i = 0; i < sc0; i++ )
    {
      for ( int ii = i?1:0; ii <= 4; ii++ )
      {
        u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
        for ( int j = 0; j < sc1; j++ )
        {
          for ( int jj = j?1:0; jj <= 4; jj++ )
          {
            v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
            P = PointAt(u,v);
            r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(P));
            if ( fabs(arc.radius - r) > tol )
            {
              onfree(s);
              return false;
            }
          }
        }
      }
    }
    onfree(s);


    rc = true;
    if ( cylinder )
    {
      cylinder->Create(arc);
      rc = cylinder->IsValid();
    }
  }

  return rc;
}